

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArrayIterator.cpp
# Opt level: O1

Var Js::JavascriptArrayIterator::EntryNext(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  JavascriptLibrary *this;
  ulong uVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 *puVar7;
  Var pvVar8;
  JavascriptArrayIterator *pJVar9;
  JavascriptArray *pJVar10;
  TypedArrayBase *pTVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  JavascriptArray *pJVar12;
  uint64 uVar13;
  uint64 uVar14;
  DynamicObject *pDVar15;
  Var pvVar16;
  ulong uVar17;
  double dVar18;
  int in_stack_00000010;
  undefined1 local_60 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArrayIterator.cpp"
                                ,0x1a,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00bbdcd9;
    *puVar7 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_60 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_60,(CallInfo *)&args.super_Arguments.Values);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  bVar4 = ScriptContext::IsJsBuiltInEnabled(pSVar1);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArrayIterator.cpp"
                                ,0x1e,"(!scriptContext->IsJsBuiltInEnabled())",
                                "!scriptContext->IsJsBuiltInEnabled()");
    if (!bVar4) goto LAB_00bbdcd9;
    *puVar7 = 0;
  }
  this = (pSVar1->super_ScriptContextBase).javascriptLibrary;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArrayIterator.cpp"
                                ,0x23,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) goto LAB_00bbdcd9;
    *puVar7 = 0;
  }
  pvVar8 = Arguments::operator[]((Arguments *)local_60,0);
  bVar4 = VarIs<Js::JavascriptArrayIterator>(pvVar8);
  if (!bVar4) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ebf4,L"Array Iterator.prototype.next");
  }
  pJVar9 = VarTo<Js::JavascriptArrayIterator>(pvVar8);
  pvVar8 = (pJVar9->m_iterableObject).ptr;
  if (pvVar8 == (Var)0x0) goto LAB_00bbd8e0;
  bVar4 = JavascriptArray::IsNonES5Array(pvVar8);
  if (bVar4) {
    pJVar10 = VarTo<Js::JavascriptArray>(pvVar8);
    iVar5 = (*(pJVar10->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x66])(pJVar10);
    if (iVar5 != 0) goto LAB_00bbd765;
    bVar4 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(pvVar8);
    if (bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArrayIterator.cpp"
                                  ,0x3a,"(!VarIs<JavascriptCopyOnAccessNativeIntArray>(iterable))",
                                  "!VarIs<JavascriptCopyOnAccessNativeIntArray>(iterable)");
      if (!bVar4) goto LAB_00bbdcd9;
      *puVar7 = 0;
    }
    pJVar10 = JavascriptArray::FromAnyArray(pvVar8);
    uVar17 = (ulong)(pJVar10->super_ArrayObject).length;
LAB_00bbd823:
    pTVar11 = (TypedArrayBase *)0x0;
  }
  else {
LAB_00bbd765:
    bVar4 = VarIs<Js::TypedArrayBase>(pvVar8);
    if (!bVar4) {
      pvVar16 = JavascriptOperators::OP_GetLength(pvVar8,pSVar1);
      uVar17 = JavascriptConversion::ToLength(pvVar16,pSVar1);
      pJVar10 = (JavascriptArray *)0x0;
      goto LAB_00bbd823;
    }
    pTVar11 = UnsafeVarTo<Js::TypedArrayBase>(pvVar8);
    if (((pTVar11->super_ArrayBufferParent).arrayBuffer.ptr)->isDetached == true) {
      JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ebe5,(PCWSTR)0x0);
    }
    uVar17 = (ulong)(pTVar11->super_ArrayBufferParent).super_ArrayObject.length;
    pJVar10 = (JavascriptArray *)0x0;
  }
  uVar2 = pJVar9->m_nextIndex;
  if ((long)uVar17 <= (long)uVar2) {
    (pJVar9->m_iterableObject).ptr = (void *)0x0;
LAB_00bbd8e0:
    pDVar15 = JavascriptLibrary::CreateIteratorResultObjectDone(this);
    return pDVar15;
  }
  pJVar9->m_nextIndex = uVar2 + 1;
  iVar5 = (int)uVar2;
  if (pJVar9->m_kind == Key) {
    if ((long)iVar5 == uVar2) {
      pJVar10 = (JavascriptArray *)(uVar2 & 0xffffffff | 0x1000000000000);
    }
    else {
      dVar18 = (double)(long)uVar2;
      uVar13 = NumberUtilities::ToSpecial(dVar18);
      bVar4 = NumberUtilities::IsNan(dVar18);
      if (((bVar4) && (uVar14 = NumberUtilities::ToSpecial(dVar18), uVar14 != 0xfff8000000000000))
         && (uVar14 = NumberUtilities::ToSpecial(dVar18), uVar14 != 0x7ff8000000000000)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                    ,0xa2,
                                    "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                    ,"We should only produce a NaN with this value");
        if (!bVar4) goto LAB_00bbdcd9;
        *puVar7 = 0;
      }
      pJVar10 = (JavascriptArray *)(uVar13 ^ 0xfffc000000000000);
    }
  }
  else {
    if (pJVar10 == (JavascriptArray *)0x0) {
      if (pTVar11 == (TypedArrayBase *)0x0) {
        if ((long)iVar5 == uVar2) {
          pvVar16 = (Var)(uVar2 & 0xffffffff | 0x1000000000000);
        }
        else {
          dVar18 = (double)(long)uVar2;
          uVar13 = NumberUtilities::ToSpecial(dVar18);
          bVar4 = NumberUtilities::IsNan(dVar18);
          if (((bVar4) &&
              (uVar14 = NumberUtilities::ToSpecial(dVar18), uVar14 != 0xfff8000000000000)) &&
             (uVar14 = NumberUtilities::ToSpecial(dVar18), uVar14 != 0x7ff8000000000000)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar7 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar4) goto LAB_00bbdcd9;
            *puVar7 = 0;
          }
          pvVar16 = (Var)(uVar13 ^ 0xfffc000000000000);
        }
        pJVar10 = (JavascriptArray *)JavascriptOperators::OP_GetElementI(pvVar8,pvVar16,pSVar1);
      }
      else {
        if (0xffffffff < (long)uVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArrayIterator.cpp"
                                      ,0x67,"(index <= 0xffffffff)","index <= UINT_MAX");
          if (!bVar4) goto LAB_00bbdcd9;
          *puVar7 = 0;
        }
        iVar6 = (*(pTVar11->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x72])(pTVar11,uVar2);
        pJVar10 = (JavascriptArray *)CONCAT44(extraout_var_00,iVar6);
      }
    }
    else {
      if (0xffffffff < (long)uVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArrayIterator.cpp"
                                    ,0x62,"(index <= 0xffffffff)","index <= UINT_MAX");
        if (!bVar4) goto LAB_00bbdcd9;
        *puVar7 = 0;
      }
      iVar6 = (*(pJVar10->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x72])(pJVar10,uVar2);
      pJVar10 = (JavascriptArray *)CONCAT44(extraout_var,iVar6);
    }
    if (pJVar9->m_kind != KeyAndValue) {
      if (pJVar9->m_kind == Value) goto LAB_00bbdcc3;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArrayIterator.cpp"
                                  ,0x74,
                                  "(iterator->m_kind == JavascriptArrayIteratorKind::KeyAndValue)",
                                  "iterator->m_kind == JavascriptArrayIteratorKind::KeyAndValue");
      if (!bVar4) goto LAB_00bbdcd9;
      *puVar7 = 0;
    }
    pJVar12 = JavascriptLibrary::CreateArray(this,2);
    if ((long)iVar5 == uVar2) {
      uVar17 = uVar2 & 0xffffffff | 0x1000000000000;
    }
    else {
      dVar18 = (double)(long)uVar2;
      uVar13 = NumberUtilities::ToSpecial(dVar18);
      bVar4 = NumberUtilities::IsNan(dVar18);
      if (((bVar4) && (uVar14 = NumberUtilities::ToSpecial(dVar18), uVar14 != 0xfff8000000000000))
         && (uVar14 = NumberUtilities::ToSpecial(dVar18), uVar14 != 0x7ff8000000000000)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                    ,0xa2,
                                    "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                    ,"We should only produce a NaN with this value");
        if (!bVar4) {
LAB_00bbdcd9:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar7 = 0;
      }
      uVar17 = uVar13 ^ 0xfffc000000000000;
    }
    (*(pJVar12->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar12,0,uVar17,0);
    (*(pJVar12->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (pJVar12,1,pJVar10,0);
    pJVar10 = pJVar12;
  }
LAB_00bbdcc3:
  pDVar15 = JavascriptLibrary::CreateIteratorResultObject(this,pJVar10,false);
  return pDVar15;
}

Assistant:

Var JavascriptArrayIterator::EntryNext(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

#ifdef ENABLE_JS_BUILTINS
        Assert(!scriptContext->IsJsBuiltInEnabled());
#endif

        JavascriptLibrary* library = scriptContext->GetLibrary();

        Assert(!(callInfo.Flags & CallFlags_New));

        Var thisObj = args[0];

        if (!VarIs<JavascriptArrayIterator>(thisObj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedArrayIterator, _u("Array Iterator.prototype.next"));
        }

        JavascriptArrayIterator* iterator = VarTo<JavascriptArrayIterator>(thisObj);
        Var iterable = iterator->m_iterableObject;

        if (iterable == nullptr)
        {
            return library->CreateIteratorResultObjectDone();
        }

        int64 length;
        JavascriptArray* pArr = nullptr;
        TypedArrayBase *typedArrayBase = nullptr;
        if (JavascriptArray::IsNonES5Array(iterable) && !VarTo<JavascriptArray>(iterable)->IsCrossSiteObject())
        {
#if ENABLE_COPYONACCESS_ARRAY
            Assert(!VarIs<JavascriptCopyOnAccessNativeIntArray>(iterable));
#endif
            pArr = JavascriptArray::FromAnyArray(iterable);
            length = pArr->GetLength();
        }
        else if (VarIs<TypedArrayBase>(iterable))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(iterable);
            if (typedArrayBase->IsDetachedBuffer())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray);
            }

            length = typedArrayBase->GetLength();
        }
        else
        {
            length = JavascriptConversion::ToLength(JavascriptOperators::OP_GetLength(iterable, scriptContext), scriptContext);
        }

        int64 index = iterator->m_nextIndex;

        if (index >= length)
        {
            // Nulling out the m_iterableObject field is important so that the iterator
            // does not keep the iterable object alive after iteration is completed.
            iterator->m_iterableObject = nullptr;
            return library->CreateIteratorResultObjectDone();
        }

        iterator->m_nextIndex += 1;

        if (iterator->m_kind == JavascriptArrayIteratorKind::Key)
        {
            return library->CreateIteratorResultObject(JavascriptNumber::ToVar(index, scriptContext));
        }

        Var value;
        if (pArr != nullptr)
        {
            Assert(index <= UINT_MAX);
            value = pArr->DirectGetItem((uint32)index);
        }
        else if (typedArrayBase != nullptr)
        {
            Assert(index <= UINT_MAX);
            value = typedArrayBase->DirectGetItem((uint32)index);
        }
        else
        {
            value = JavascriptOperators::OP_GetElementI(iterable, JavascriptNumber::ToVar(index, scriptContext), scriptContext);
        }

        if (iterator->m_kind == JavascriptArrayIteratorKind::Value)
        {
            return library->CreateIteratorResultObject(value);
        }

        Assert(iterator->m_kind == JavascriptArrayIteratorKind::KeyAndValue);

        JavascriptArray* keyValueTuple = library->CreateArray(2);

        keyValueTuple->SetItem(0, JavascriptNumber::ToVar(index, scriptContext), PropertyOperation_None);
        keyValueTuple->SetItem(1, value, PropertyOperation_None);

        return library->CreateIteratorResultObject(keyValueTuple);
    }